

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O0

bool modify_stat(string *name,function<int_(int)> *f,Character *victim)

{
  World *pWVar1;
  bool bVar2;
  Gender GVar3;
  Skin SVar4;
  int iVar5;
  mapped_type *pmVar6;
  size_type sVar7;
  uint local_584;
  undefined1 local_388 [8];
  PacketBuilder builder_1;
  PacketBuilder builder;
  int local_320 [4];
  int local_310 [3];
  allocator<char> local_301;
  key_type local_300;
  Skin local_2dc [3];
  allocator<char> local_2d9;
  key_type local_2d8;
  int local_2b8 [3];
  allocator<char> local_2a9;
  key_type local_2a8;
  int local_284 [3];
  Gender local_278 [3];
  AdminLevel local_275 [3];
  AdminLevel local_272;
  allocator<char> local_271;
  undefined1 local_270 [6];
  AdminLevel level_1;
  allocator<char> local_249;
  key_type local_248;
  int local_228 [3];
  allocator<char> local_219;
  key_type local_218;
  allocator<char> local_1f1;
  key_type local_1f0;
  int local_1d0 [3];
  allocator<char> local_1c1;
  key_type local_1c0;
  int local_1a0 [3];
  allocator<char> local_191;
  key_type local_190;
  int local_170 [3];
  allocator<char> local_161;
  key_type local_160;
  int local_140 [3];
  allocator<char> local_131;
  key_type local_130;
  int local_110 [3];
  allocator<char> local_101;
  key_type local_100;
  int local_e0 [3];
  allocator<char> local_d1;
  key_type local_d0;
  int local_b0 [3];
  allocator<char> local_a1;
  key_type local_a0;
  int local_80 [7];
  allocator<char> local_61;
  key_type local_60;
  int local_3c [3];
  byte local_2e;
  byte local_2d;
  byte local_2c;
  byte local_2b;
  byte local_2a;
  byte local_29;
  bool skillpoints;
  bool statpoints;
  bool karma;
  bool stats;
  bool level;
  Character *pCStack_28;
  bool appearance;
  Character *victim_local;
  function<int_(int)> *f_local;
  string *name_local;
  
  local_29 = 0;
  local_2a = 0;
  local_2b = 0;
  local_2c = 0;
  local_2d = 0;
  local_2e = 0;
  pCStack_28 = victim;
  victim_local = (Character *)f;
  f_local = (function<int_(int)> *)name;
  bVar2 = std::operator==(name,"level");
  if (bVar2) {
    local_3c[2] = std::function<int_(int)>::operator()(f,(uint)pCStack_28->level);
    local_3c[1] = 0;
    pWVar1 = pCStack_28->world;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"MaxLevel",&local_61);
    pmVar6 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](&(pWVar1->config).
                           super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                          ,&local_60);
    local_3c[0] = util::variant::operator_cast_to_int(pmVar6);
    iVar5 = util::clamp<int>(local_3c + 2,local_3c + 1,local_3c);
    local_2a = 1;
    pCStack_28->level = (uchar)iVar5;
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  else {
    bVar2 = std::operator==(name,"exp");
    if (bVar2) {
      local_80[2] = std::function<int_(int)>::operator()(f,pCStack_28->exp);
      local_80[1] = 0;
      pWVar1 = pCStack_28->world;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"MaxEXP",&local_a1);
      pmVar6 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
               ::operator[](&(pWVar1->config).
                             super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                            ,&local_a0);
      local_80[0] = util::variant::operator_cast_to_int(pmVar6);
      iVar5 = util::clamp<int>(local_80 + 2,local_80 + 1,local_80);
      local_2a = 1;
      pCStack_28->exp = iVar5;
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator(&local_a1);
    }
    else {
      bVar2 = std::operator==(name,"str");
      if (bVar2) {
        local_b0[2] = std::function<int_(int)>::operator()(f,pCStack_28->str);
        local_b0[1] = 0;
        pWVar1 = pCStack_28->world;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"MaxStat",&local_d1);
        pmVar6 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                 ::operator[](&(pWVar1->config).
                               super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                              ,&local_d0);
        local_b0[0] = util::variant::operator_cast_to_int(pmVar6);
        iVar5 = util::clamp<int>(local_b0 + 2,local_b0 + 1,local_b0);
        local_2b = 1;
        pCStack_28->str = iVar5;
        std::__cxx11::string::~string((string *)&local_d0);
        std::allocator<char>::~allocator(&local_d1);
      }
      else {
        bVar2 = std::operator==(name,"int");
        if (bVar2) {
          local_e0[2] = std::function<int_(int)>::operator()(f,pCStack_28->intl);
          local_e0[1] = 0;
          pWVar1 = pCStack_28->world;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_100,"MaxStat",&local_101);
          pmVar6 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                   ::operator[](&(pWVar1->config).
                                 super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                ,&local_100);
          local_e0[0] = util::variant::operator_cast_to_int(pmVar6);
          iVar5 = util::clamp<int>(local_e0 + 2,local_e0 + 1,local_e0);
          local_2b = 1;
          pCStack_28->intl = iVar5;
          std::__cxx11::string::~string((string *)&local_100);
          std::allocator<char>::~allocator(&local_101);
        }
        else {
          bVar2 = std::operator==(name,"wis");
          if (bVar2) {
            local_110[2] = std::function<int_(int)>::operator()(f,pCStack_28->wis);
            local_110[1] = 0;
            pWVar1 = pCStack_28->world;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_130,"MaxStat",&local_131);
            pmVar6 = std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                     ::operator[](&(pWVar1->config).
                                   super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                  ,&local_130);
            local_110[0] = util::variant::operator_cast_to_int(pmVar6);
            iVar5 = util::clamp<int>(local_110 + 2,local_110 + 1,local_110);
            local_2b = 1;
            pCStack_28->wis = iVar5;
            std::__cxx11::string::~string((string *)&local_130);
            std::allocator<char>::~allocator(&local_131);
          }
          else {
            bVar2 = std::operator==(name,"agi");
            if (bVar2) {
              local_140[2] = std::function<int_(int)>::operator()(f,pCStack_28->agi);
              local_140[1] = 0;
              pWVar1 = pCStack_28->world;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_160,"MaxStat",&local_161);
              pmVar6 = std::
                       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                       ::operator[](&(pWVar1->config).
                                     super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                    ,&local_160);
              local_140[0] = util::variant::operator_cast_to_int(pmVar6);
              iVar5 = util::clamp<int>(local_140 + 2,local_140 + 1,local_140);
              local_2b = 1;
              pCStack_28->agi = iVar5;
              std::__cxx11::string::~string((string *)&local_160);
              std::allocator<char>::~allocator(&local_161);
            }
            else {
              bVar2 = std::operator==(name,"con");
              if (bVar2) {
                local_170[2] = std::function<int_(int)>::operator()(f,pCStack_28->con);
                local_170[1] = 0;
                pWVar1 = pCStack_28->world;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_190,"MaxStat",&local_191);
                pmVar6 = std::
                         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         ::operator[](&(pWVar1->config).
                                       super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                      ,&local_190);
                local_170[0] = util::variant::operator_cast_to_int(pmVar6);
                iVar5 = util::clamp<int>(local_170 + 2,local_170 + 1,local_170);
                local_2b = 1;
                pCStack_28->con = iVar5;
                std::__cxx11::string::~string((string *)&local_190);
                std::allocator<char>::~allocator(&local_191);
              }
              else {
                bVar2 = std::operator==(name,"cha");
                if (bVar2) {
                  local_1a0[2] = std::function<int_(int)>::operator()(f,pCStack_28->cha);
                  local_1a0[1] = 0;
                  pWVar1 = pCStack_28->world;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_1c0,"MaxStat",&local_1c1);
                  pmVar6 = std::
                           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                           ::operator[](&(pWVar1->config).
                                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                        ,&local_1c0);
                  local_1a0[0] = util::variant::operator_cast_to_int(pmVar6);
                  iVar5 = util::clamp<int>(local_1a0 + 2,local_1a0 + 1,local_1a0);
                  local_2b = 1;
                  pCStack_28->cha = iVar5;
                  std::__cxx11::string::~string((string *)&local_1c0);
                  std::allocator<char>::~allocator(&local_1c1);
                }
                else {
                  bVar2 = std::operator==(name,"statpoints");
                  if (bVar2) {
                    local_1d0[2] = std::function<int_(int)>::operator()(f,pCStack_28->statpoints);
                    local_1d0[1] = 0;
                    pWVar1 = pCStack_28->world;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_1f0,"MaxLevel",&local_1f1);
                    pmVar6 = std::
                             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                             ::operator[](&(pWVar1->config).
                                           super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                          ,&local_1f0);
                    iVar5 = util::variant::operator_cast_to_int(pmVar6);
                    pWVar1 = pCStack_28->world;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_218,"StatPerLevel",&local_219);
                    pmVar6 = std::
                             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                             ::operator[](&(pWVar1->config).
                                           super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                          ,&local_218);
                    local_1d0[0] = util::variant::operator_cast_to_int(pmVar6);
                    local_1d0[0] = iVar5 * local_1d0[0];
                    iVar5 = util::clamp<int>(local_1d0 + 2,local_1d0 + 1,local_1d0);
                    local_2d = 1;
                    pCStack_28->statpoints = iVar5;
                    std::__cxx11::string::~string((string *)&local_218);
                    std::allocator<char>::~allocator(&local_219);
                    std::__cxx11::string::~string((string *)&local_1f0);
                    std::allocator<char>::~allocator(&local_1f1);
                  }
                  else {
                    bVar2 = std::operator==(name,"skillpoints");
                    if (bVar2) {
                      local_228[2] = std::function<int_(int)>::operator()(f,pCStack_28->skillpoints)
                      ;
                      local_228[1] = 0;
                      pWVar1 = pCStack_28->world;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_248,"MaxLevel",&local_249);
                      pmVar6 = std::
                               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                               ::operator[](&(pWVar1->config).
                                             super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                            ,&local_248);
                      iVar5 = util::variant::operator_cast_to_int(pmVar6);
                      pWVar1 = pCStack_28->world;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)local_270,"SkillPerLevel",&local_271);
                      pmVar6 = std::
                               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                               ::operator[](&(pWVar1->config).
                                             super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                            ,(key_type *)local_270);
                      local_228[0] = util::variant::operator_cast_to_int(pmVar6);
                      local_228[0] = iVar5 * local_228[0];
                      iVar5 = util::clamp<int>(local_228 + 2,local_228 + 1,local_228);
                      local_2e = 1;
                      pCStack_28->skillpoints = iVar5;
                      std::__cxx11::string::~string((string *)local_270);
                      std::allocator<char>::~allocator(&local_271);
                      std::__cxx11::string::~string((string *)&local_248);
                      std::allocator<char>::~allocator(&local_249);
                    }
                    else {
                      bVar2 = std::operator==(name,"admin");
                      if (bVar2) {
                        iVar5 = std::function<int_(int)>::operator()(f,(uint)pCStack_28->admin);
                        local_275[2] = (AdminLevel)iVar5;
                        local_275[1] = 0;
                        local_275[0] = ADMIN_HGM;
                        local_272 = util::clamp<AdminLevel>(local_275 + 2,local_275 + 1,local_275);
                        if ((local_272 == ADMIN_PLAYER) && (pCStack_28->admin != ADMIN_PLAYER)) {
                          World::DecAdminCount(pCStack_28->world);
                        }
                        else if ((local_272 != ADMIN_PLAYER) && (pCStack_28->admin == ADMIN_PLAYER))
                        {
                          World::IncAdminCount(pCStack_28->world);
                        }
                        pCStack_28->admin = local_272;
                      }
                      else {
                        bVar2 = std::operator==(name,"gender");
                        if (bVar2) {
                          iVar5 = std::function<int_(int)>::operator()(f,(uint)pCStack_28->gender);
                          local_278[2] = (Gender)iVar5;
                          local_278[1] = 0;
                          local_278[0] = GENDER_MALE;
                          GVar3 = util::clamp<Gender>(local_278 + 2,local_278 + 1,local_278);
                          local_29 = 1;
                          pCStack_28->gender = GVar3;
                        }
                        else {
                          bVar2 = std::operator==(name,"hairstyle");
                          if (bVar2) {
                            local_284[2] = std::function<int_(int)>::operator()
                                                     (f,(uint)pCStack_28->hairstyle);
                            local_284[1] = 0;
                            pWVar1 = pCStack_28->world;
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_2a8,"MaxHairStyle",&local_2a9);
                            pmVar6 = std::
                                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                     ::operator[](&(pWVar1->config).
                                                                                                      
                                                  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                                  ,&local_2a8);
                            local_284[0] = util::variant::operator_cast_to_int(pmVar6);
                            iVar5 = util::clamp<int>(local_284 + 2,local_284 + 1,local_284);
                            local_29 = 1;
                            pCStack_28->hairstyle = (uchar)iVar5;
                            std::__cxx11::string::~string((string *)&local_2a8);
                            std::allocator<char>::~allocator(&local_2a9);
                          }
                          else {
                            bVar2 = std::operator==(name,"haircolor");
                            if (bVar2) {
                              local_2b8[2] = std::function<int_(int)>::operator()
                                                       (f,(uint)pCStack_28->haircolor);
                              local_2b8[1] = 0;
                              pWVar1 = pCStack_28->world;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_2d8,"MaxHairColor",&local_2d9);
                              pmVar6 = std::
                                       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                       ::operator[](&(pWVar1->config).
                                                                                                          
                                                  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                                  ,&local_2d8);
                              local_2b8[0] = util::variant::operator_cast_to_int(pmVar6);
                              iVar5 = util::clamp<int>(local_2b8 + 2,local_2b8 + 1,local_2b8);
                              local_29 = 1;
                              pCStack_28->haircolor = (uchar)iVar5;
                              std::__cxx11::string::~string((string *)&local_2d8);
                              std::allocator<char>::~allocator(&local_2d9);
                            }
                            else {
                              bVar2 = std::operator==(name,"race");
                              if (bVar2) {
                                iVar5 = std::function<int_(int)>::operator()
                                                  (f,(uint)pCStack_28->race);
                                local_2dc[2] = (Skin)iVar5;
                                local_2dc[1] = 0;
                                pWVar1 = pCStack_28->world;
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_300,"MaxSkin",&local_301);
                                pmVar6 = std::
                                         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                         ::operator[](&(pWVar1->config).
                                                                                                              
                                                  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                                  ,&local_300);
                                iVar5 = util::variant::operator_cast_to_int(pmVar6);
                                local_2dc[0] = (Skin)iVar5;
                                SVar4 = util::clamp<Skin>(local_2dc + 2,local_2dc + 1,local_2dc);
                                local_29 = 1;
                                pCStack_28->race = SVar4;
                                std::__cxx11::string::~string((string *)&local_300);
                                std::allocator<char>::~allocator(&local_301);
                              }
                              else {
                                bVar2 = std::operator==(name,"guildrank");
                                if (bVar2) {
                                  local_310[2] = std::function<int_(int)>::operator()
                                                           (f,(uint)pCStack_28->guild_rank);
                                  local_310[1] = 0;
                                  local_310[0] = 9;
                                  iVar5 = util::clamp<int>(local_310 + 2,local_310 + 1,local_310);
                                  pCStack_28->guild_rank = (uchar)iVar5;
                                }
                                else {
                                  bVar2 = std::operator==(name,"karma");
                                  if (bVar2) {
                                    local_320[3] = std::function<int_(int)>::operator()
                                                             (f,pCStack_28->karma);
                                    local_320[2] = 0;
                                    local_320[1] = 2000;
                                    iVar5 = util::clamp<int>(local_320 + 3,local_320 + 2,
                                                             local_320 + 1);
                                    local_2c = 1;
                                    pCStack_28->karma = iVar5;
                                  }
                                  else {
                                    bVar2 = std::operator==(name,"class");
                                    if (!bVar2) {
                                      return false;
                                    }
                                    local_320[0] = std::function<int_(int)>::operator()
                                                             (f,(uint)pCStack_28->clas);
                                    builder.add_size._4_4_ = 0;
                                    sVar7 = std::
                                            vector<ECF_Data_Base<ECF>,_std::allocator<ECF_Data_Base<ECF>_>_>
                                            ::size(&pCStack_28->world->ecf->data);
                                    builder.add_size._0_4_ = (int)sVar7 + -1;
                                    iVar5 = util::clamp<int>(local_320,
                                                             (int *)((long)&builder.add_size + 4),
                                                             (int *)&builder.add_size);
                                    local_2b = 1;
                                    pCStack_28->clas = (uchar)iVar5;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if ((local_29 & 1) != 0) {
    Character::Warp(pCStack_28,pCStack_28->map->id,pCStack_28->x,pCStack_28->y,WARP_ANIMATION_NONE);
  }
  if (((local_2b & 1) != 0) || ((local_2d & 1) != 0)) {
    Character::CalculateStats(pCStack_28,true);
    PacketBuilder::PacketBuilder
              ((PacketBuilder *)&builder_1.add_size,PACKET_RECOVER,PACKET_LIST,0x20);
    if ((local_2d & 1) == 0) {
      PacketBuilder::AddShort((PacketBuilder *)&builder_1.add_size,(uint)pCStack_28->clas);
    }
    else {
      PacketBuilder::SetID((PacketBuilder *)&builder_1.add_size,PACKET_STATSKILL,PACKET_PLAYER);
      PacketBuilder::AddShort((PacketBuilder *)&builder_1.add_size,pCStack_28->statpoints);
    }
    PacketBuilder::AddShort((PacketBuilder *)&builder_1.add_size,*pCStack_28->display_str);
    PacketBuilder::AddShort((PacketBuilder *)&builder_1.add_size,*pCStack_28->display_intl);
    PacketBuilder::AddShort((PacketBuilder *)&builder_1.add_size,*pCStack_28->display_wis);
    PacketBuilder::AddShort((PacketBuilder *)&builder_1.add_size,*pCStack_28->display_agi);
    PacketBuilder::AddShort((PacketBuilder *)&builder_1.add_size,*pCStack_28->display_con);
    PacketBuilder::AddShort((PacketBuilder *)&builder_1.add_size,*pCStack_28->display_cha);
    PacketBuilder::AddShort((PacketBuilder *)&builder_1.add_size,pCStack_28->maxhp);
    PacketBuilder::AddShort((PacketBuilder *)&builder_1.add_size,pCStack_28->maxtp);
    PacketBuilder::AddShort((PacketBuilder *)&builder_1.add_size,pCStack_28->maxsp);
    PacketBuilder::AddShort((PacketBuilder *)&builder_1.add_size,pCStack_28->maxweight);
    PacketBuilder::AddShort((PacketBuilder *)&builder_1.add_size,pCStack_28->mindam);
    PacketBuilder::AddShort((PacketBuilder *)&builder_1.add_size,pCStack_28->maxdam);
    PacketBuilder::AddShort((PacketBuilder *)&builder_1.add_size,pCStack_28->accuracy);
    PacketBuilder::AddShort((PacketBuilder *)&builder_1.add_size,pCStack_28->evade);
    PacketBuilder::AddShort((PacketBuilder *)&builder_1.add_size,pCStack_28->armor);
    Character::Send(pCStack_28,(PacketBuilder *)&builder_1.add_size);
    PacketBuilder::~PacketBuilder((PacketBuilder *)&builder_1.add_size);
  }
  if (((local_2c & 1) != 0) || ((local_2a & 1) != 0)) {
    PacketBuilder::PacketBuilder((PacketBuilder *)local_388,PACKET_RECOVER,PACKET_REPLY,7);
    PacketBuilder::AddInt((PacketBuilder *)local_388,pCStack_28->exp);
    PacketBuilder::AddShort((PacketBuilder *)local_388,pCStack_28->karma);
    if ((local_2a & 1) == 0) {
      local_584 = 0;
    }
    else {
      local_584 = (uint)pCStack_28->level;
    }
    PacketBuilder::AddChar((PacketBuilder *)local_388,local_584);
    Character::Send(pCStack_28,(PacketBuilder *)local_388);
    PacketBuilder::~PacketBuilder((PacketBuilder *)local_388);
  }
  if ((((local_2b & 1) == 0) && ((local_2e & 1) == 0)) && ((local_29 & 1) == 0)) {
    Character::CheckQuestRules(pCStack_28);
  }
  return true;
}

Assistant:

static bool modify_stat(std::string name, std::function<int(int)> f, Character* victim)
{
	bool appearance = false;
	bool level = false;
	bool stats = false;
	bool karma = false;

	bool statpoints = false;
	bool skillpoints = false;

		 if (name == "level") (level = true, victim->level) = util::clamp<int>(f(victim->level), 0, victim->world->config["MaxLevel"]);
	else if (name == "exp")   (level = true, victim->exp)   = util::clamp<int>(f(victim->exp),   0, victim->world->config["MaxEXP"]);
	else if (name == "str")   (stats = true, victim->str)   = util::clamp<int>(f(victim->str),   0, victim->world->config["MaxStat"]);
	else if (name == "int")   (stats = true, victim->intl)  = util::clamp<int>(f(victim->intl),  0, victim->world->config["MaxStat"]);
	else if (name == "wis")   (stats = true, victim->wis)   = util::clamp<int>(f(victim->wis),   0, victim->world->config["MaxStat"]);
	else if (name == "agi")   (stats = true, victim->agi)   = util::clamp<int>(f(victim->agi),   0, victim->world->config["MaxStat"]);
	else if (name == "con")   (stats = true, victim->con)   = util::clamp<int>(f(victim->con),   0, victim->world->config["MaxStat"]);
	else if (name == "cha")   (stats = true, victim->cha)   = util::clamp<int>(f(victim->cha),   0, victim->world->config["MaxStat"]);
	else if (name == "statpoints")  (statpoints = true,  victim->statpoints)  = util::clamp<int>(f(victim->statpoints),  0, int(victim->world->config["MaxLevel"]) * int(victim->world->config["StatPerLevel"]));
	else if (name == "skillpoints") (skillpoints = true, victim->skillpoints) = util::clamp<int>(f(victim->skillpoints), 0, int(victim->world->config["MaxLevel"]) * int(victim->world->config["SkillPerLevel"]));
	else if (name == "admin")
	{
		AdminLevel level = util::clamp<AdminLevel>(AdminLevel(f(victim->admin)), ADMIN_PLAYER, ADMIN_HGM);

		if (level == ADMIN_PLAYER && victim->admin != ADMIN_PLAYER)
			victim->world->DecAdminCount();
		else if (level != ADMIN_PLAYER && victim->admin == ADMIN_PLAYER)
			victim->world->IncAdminCount();

		victim->admin = level;
	}
	else if (name == "gender")    (appearance = true, victim->gender)    = util::clamp<Gender>(Gender(f(victim->gender)), Gender(0), Gender(1));
	else if (name == "hairstyle") (appearance = true, victim->hairstyle) = util::clamp<int>(f(victim->hairstyle),         0, victim->world->config["MaxHairStyle"]);
	else if (name == "haircolor") (appearance = true, victim->haircolor) = util::clamp<int>(f(victim->haircolor),         0, victim->world->config["MaxHairColor"]);
	else if (name == "race")      (appearance = true, victim->race)      = util::clamp<Skin>(Skin(f(victim->race)),       Skin(0), Skin(int(victim->world->config["MaxSkin"])));
	else if (name == "guildrank") victim->guild_rank = util::clamp<int>(f(victim->guild_rank), 0, 9);
	else if (name == "karma") (karma = true, victim->karma) = util::clamp<int>(f(victim->karma), 0, 2000);
	else if (name == "class") (stats = true, victim->clas)  = util::clamp<int>(f(victim->clas),  0, victim->world->ecf->data.size() - 1);
	else return false;

	// Easiest way to get the character to update on everyone nearby's screen
	if (appearance)
		victim->Warp(victim->map->id, victim->x, victim->y);

	// TODO: Good way of updating skillpoints
	(void)skillpoints;

	if (stats || statpoints)
	{
		victim->CalculateStats();

		PacketBuilder builder(PACKET_RECOVER, PACKET_LIST, 32);

		if (statpoints)
		{
			builder.SetID(PACKET_STATSKILL, PACKET_PLAYER);
			builder.AddShort(victim->statpoints);
		}
		else
		{
			builder.AddShort(victim->clas);
		}

		builder.AddShort(victim->display_str);
		builder.AddShort(victim->display_intl);
		builder.AddShort(victim->display_wis);
		builder.AddShort(victim->display_agi);
		builder.AddShort(victim->display_con);
		builder.AddShort(victim->display_cha);
		builder.AddShort(victim->maxhp);
		builder.AddShort(victim->maxtp);
		builder.AddShort(victim->maxsp);
		builder.AddShort(victim->maxweight);
		builder.AddShort(victim->mindam);
		builder.AddShort(victim->maxdam);
		builder.AddShort(victim->accuracy);
		builder.AddShort(victim->evade);
		builder.AddShort(victim->armor);
		victim->Send(builder);
	}

	if (karma || level)
	{
		PacketBuilder builder(PACKET_RECOVER, PACKET_REPLY, 7);
		builder.AddInt(victim->exp);
		builder.AddShort(victim->karma);
		builder.AddChar(level ? victim->level : 0);
		victim->Send(builder);
	}

	if (!stats && !skillpoints && !appearance)
	{
		victim->CheckQuestRules();
	}

	return true;
}